

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine_generic.c
# Opt level: O0

rt_function_error_t exec_affine_generic(rt_function_t *f)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  code *pcVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  int bpos;
  int opos_1;
  float x;
  float w;
  int wpos;
  int ipos;
  float y0;
  int weight_offset;
  int opos;
  int input_offset;
  int output_offset;
  int k;
  int j;
  int i;
  affine_private_t *p;
  rt_function_t *f_local;
  
  puVar3 = *f->local_context;
  for (k = 0; k < *(int *)(puVar3 + 9); k = k + 1) {
    (*(code *)puVar3[10])(0,puVar3[8],k);
  }
  for (input_offset = 0; input_offset < *(int *)(puVar3 + 0xc); input_offset = input_offset + 1) {
    iVar1 = *(int *)(puVar3 + 0xd);
    iVar7 = *(int *)((long)puVar3 + 100);
    for (output_offset = 0; output_offset < *(int *)(puVar3 + 0xd);
        output_offset = output_offset + 1) {
      iVar6 = input_offset * iVar1 + output_offset;
      iVar2 = *(int *)((long)puVar3 + 100);
      wpos = (*(code *)puVar3[0xb])(puVar3[8],iVar6);
      for (k = 0; k < *(int *)((long)puVar3 + 100); k = k + 1) {
        fVar8 = (float)(*(code *)puVar3[3])(puVar3[2],output_offset * iVar2 + k);
        fVar9 = (float)(*(code *)puVar3[1])(*puVar3,input_offset * iVar7 + k);
        wpos = (int)(fVar9 * fVar8 + (float)wpos);
      }
      if (puVar3[6] != 0) {
        fVar8 = (float)(*(code *)puVar3[7])(puVar3[6],output_offset);
        wpos = (int)(fVar8 * (float)wpos);
      }
      (*(code *)puVar3[10])(wpos,puVar3[8],iVar6);
    }
    if (puVar3[4] != 0) {
      for (k = 0; k < *(int *)(puVar3 + 0xd); k = k + 1) {
        iVar7 = input_offset * iVar1 + k;
        pcVar4 = (code *)puVar3[10];
        uVar5 = puVar3[8];
        fVar8 = (float)(*(code *)puVar3[0xb])(puVar3[8],iVar7);
        fVar9 = (float)(*(code *)puVar3[5])(puVar3[4],k);
        (*pcVar4)(fVar8 + fVar9,uVar5,iVar7);
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_affine_generic(rt_function_t *f) {
  affine_private_t *p =
      (affine_private_t *)(((affine_local_context_t *)(f->local_context))
                               ->data);
  int i, j, k; // Iterators.

  // Clear output
  for (i = 0; i < p->output_size; i++) {
    p->set_output(p->output, i, 0);
  }

  for (k = 0; k < p->base_loop_size; k++) {
    int output_offset = k * p->output_loop_size;
    int input_offset = k * p->input_loop_size;

    // Weight
    for (j = 0; j < p->output_loop_size; ++j) {
      int opos = output_offset + j;
      int weight_offset = j * p->input_loop_size;
      float y0 = p->get_output(p->output, opos);

      for (i = 0; i < p->input_loop_size; ++i) {
        int ipos = input_offset + i;
        int wpos = weight_offset + i;

        float w = p->get_weight(p->weight, wpos);
        float x = p->get_input(p->input, ipos);
        y0 += x * w;
      }

      if (p->alpha) {
        y0 *= p->get_alpha(p->alpha, j);
      }

      p->set_output(p->output, opos, y0);
    }

    // Bias
    if (p->bias) {
      for (i = 0; i < p->output_loop_size; i++) {
        int opos = output_offset + i;
        int bpos = i;
        p->set_output(p->output, opos,
                      p->get_output(p->output, opos) +
                          p->get_bias(p->bias, bpos));
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}